

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_update_agent_tri_seed(REF_INTERP ref_interp,REF_INT id,REF_INT node0,REF_INT node1)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_AGENTS pRVar3;
  REF_AGENT_STRUCT *pRVar4;
  uint uVar5;
  REF_INT *pRVar6;
  long lVar7;
  REF_INT ncell;
  REF_INT cells [2];
  int local_3c;
  int local_38;
  int local_34;
  
  pRVar2 = ref_interp->from_grid->node;
  pRVar3 = ref_interp->ref_agents;
  uVar5 = ref_cell_list_with2(ref_interp->from_tri,node0,node1,2,&local_3c,&local_38);
  if (uVar5 == 0) {
    if (local_3c == 1) {
      iVar1 = pRVar2->ref_mpi->id;
      if ((iVar1 == pRVar2->part[node0]) || (iVar1 == pRVar2->part[node1])) {
        pRVar3->agent[id].mode = REF_AGENT_AT_BOUNDARY;
      }
      else {
        uVar5 = rand();
        if ((uVar5 & 0x80000001) == 1) {
          node0 = node1;
        }
        pRVar4 = pRVar3->agent;
        pRVar4[id].part = pRVar2->part[node0];
        pRVar4[id].seed = -1;
        lVar7 = -1;
        if ((-1 < node0) && (node0 < pRVar2->max)) {
          lVar7 = -1;
          if (-1 < pRVar2->global[node0]) {
            lVar7 = pRVar2->global[node0];
          }
        }
        pRVar4[id].global = lVar7;
        pRVar4[id].mode = REF_AGENT_HOP_PART;
      }
    }
    else {
      if (local_3c == 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x233,"ref_update_agent_tri_seed","bary update missing first");
        return 1;
      }
      pRVar6 = &pRVar3->agent[id].seed;
      if (*pRVar6 == local_38) {
        *pRVar6 = local_34;
      }
      else {
        if (*pRVar6 != local_34) {
          return 5;
        }
        *pRVar6 = local_38;
      }
    }
    uVar5 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x232,
           "ref_update_agent_tri_seed",(ulong)uVar5,"more then two");
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_update_agent_tri_seed(REF_INTERP ref_interp,
                                                    REF_INT id, REF_INT node0,
                                                    REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_CELL tris = ref_interp_from_tri(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT ncell, cells[2];
  REF_INT node;

  RSS(ref_cell_list_with2(tris, node0, node1, 2, &ncell, cells),
      "more then two");
  if (0 == ncell) THROW("bary update missing first");
  if (1 == ncell) {
    /* if it is off proc */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      /* pick at pseudo random */
      node = node0;
      if (1 == rand() % 2) node = node1;
      ref_agent_part(ref_agents, id) = ref_node_part(ref_node, node);
      ref_agent_seed(ref_agents, id) = REF_EMPTY;
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, node);
      ref_agent_mode(ref_agents, id) = REF_AGENT_HOP_PART;
      return REF_SUCCESS;
    }
    /* hit boundary, skip verify for no geom */
    ref_agent_mode(ref_agents, id) = REF_AGENT_AT_BOUNDARY;
    return REF_SUCCESS;
  }

  if (ref_agent_seed(ref_agents, id) == cells[0]) {
    ref_agent_seed(ref_agents, id) = cells[1];
    return REF_SUCCESS;
  }
  if (ref_agent_seed(ref_agents, id) == cells[1]) {
    ref_agent_seed(ref_agents, id) = cells[0];
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}